

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O2

batch __thiscall
ear::PolarExtentCoreSimd<xsimd::sse4_2>::weight_stadium
          (PolarExtentCoreSimd<xsimd::sse4_2> *this,PolarExtentCoreContext *ctx,
          PositionBatch<xsimd::batch<float,_xsimd::sse4_2>_> *position)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  undefined4 extraout_EAX;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  batch bVar17;
  batch bVar18;
  batch bVar19;
  PositionBatch<xsimd::batch<float,_xsimd::sse4_2>_> position_t;
  float local_88;
  float fStack_84;
  PositionBatch<xsimd::batch<float,_xsimd::sse4_2>_> local_48;
  
  PositionBatch<xsimd::batch<float,_xsimd::sse4_2>_>::transform
            (&local_48,position,ctx->flippedBasis);
  fVar16 = ctx->circle_test[0];
  fVar5 = ctx->circle_test[1];
  bVar17.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[2] =
       fVar5 * local_48.y.super_simd_register<float,_xsimd::sse4_2>.
               super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
               super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data
               [0];
  bVar17.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[3] =
       fVar5 * local_48.y.super_simd_register<float,_xsimd::sse4_2>.
               super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
               super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data
               [1];
  fVar13 = fVar16 * ABS(local_48.x.super_simd_register<float,_xsimd::sse4_2>.
                        super_simd_register<float,_xsimd::sse4_1>.
                        super_simd_register<float,_xsimd::ssse3>.
                        super_simd_register<float,_xsimd::sse3>.
                        super_simd_register<float,_xsimd::sse2>.data[0]) +
           bVar17.super_simd_register<float,_xsimd::sse4_2>.
           super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
           super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[2];
  fVar14 = fVar16 * ABS(local_48.x.super_simd_register<float,_xsimd::sse4_2>.
                        super_simd_register<float,_xsimd::sse4_1>.
                        super_simd_register<float,_xsimd::ssse3>.
                        super_simd_register<float,_xsimd::sse3>.
                        super_simd_register<float,_xsimd::sse2>.data[1]) +
           bVar17.super_simd_register<float,_xsimd::sse4_2>.
           super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
           super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[3];
  fVar15 = fVar16 * ABS(local_48.x.super_simd_register<float,_xsimd::sse4_2>.
                        super_simd_register<float,_xsimd::sse4_1>.
                        super_simd_register<float,_xsimd::ssse3>.
                        super_simd_register<float,_xsimd::sse3>.
                        super_simd_register<float,_xsimd::sse2>.data[2]) +
           fVar5 * local_48.y.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data[2];
  fVar16 = fVar16 * ABS(local_48.x.super_simd_register<float,_xsimd::sse4_2>.
                        super_simd_register<float,_xsimd::sse4_1>.
                        super_simd_register<float,_xsimd::ssse3>.
                        super_simd_register<float,_xsimd::sse3>.
                        super_simd_register<float,_xsimd::sse2>.data[3]) +
           fVar5 * local_48.y.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data[3];
  uVar1 = CONCAT44(local_48.z.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data[1],
                   local_48.z.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data[0]) & 0x7fffffff7fffffff;
  bVar17.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] = (float)(int)uVar1;
  bVar17.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] = (float)(int)(uVar1 >> 0x20);
  bVar17 = weight_from_sin(this,ctx,bVar17);
  auVar12._8_4_ = extraout_XMM0_Dc;
  auVar12._0_8_ =
       bVar17.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
       super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
       super_simd_register<float,_xsimd::sse2>.data._0_8_;
  auVar12._12_4_ = extraout_XMM0_Dd;
  bVar18.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[2] =
       ctx->right_circle_centre[1] *
       local_48.y.super_simd_register<float,_xsimd::sse4_2>.
       super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
       super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[0];
  bVar18.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[3] =
       ctx->right_circle_centre[1] *
       local_48.y.super_simd_register<float,_xsimd::sse4_2>.
       super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
       super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[1];
  bVar18.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] =
       ctx->right_circle_centre[0] *
       ABS(local_48.x.super_simd_register<float,_xsimd::sse4_2>.
           super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
           super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[0])
       + bVar18.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
         super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
         super_simd_register<float,_xsimd::sse2>.data[2];
  bVar18.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] =
       ctx->right_circle_centre[0] *
       ABS(local_48.x.super_simd_register<float,_xsimd::sse4_2>.
           super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
           super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[1])
       + bVar18.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
         super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
         super_simd_register<float,_xsimd::sse2>.data[3];
  bVar18 = weight_from_cos(this,ctx,bVar18);
  local_88 = bVar18.super_simd_register<float,_xsimd::sse4_2>.
             super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
             super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[0]
  ;
  auVar11._0_8_ =
       bVar18.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
       super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
       super_simd_register<float,_xsimd::sse2>.data._0_8_;
  auVar11._8_4_ = extraout_XMM0_Dc_00;
  auVar11._12_4_ = extraout_XMM0_Dd_00;
  auVar2._4_4_ = -(uint)(fVar14 < 0.0);
  auVar2._0_4_ = -(uint)(fVar13 < 0.0);
  auVar2._8_4_ = -(uint)(fVar15 < 0.0);
  auVar2._12_4_ = -(uint)(fVar16 < 0.0);
  iVar6 = movmskps(extraout_EAX,auVar2);
  if (iVar6 == 0) {
    local_88 = bVar17.super_simd_register<float,_xsimd::sse4_2>.
               super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
               super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data
               [0];
    fStack_84 = bVar17.super_simd_register<float,_xsimd::sse4_2>.
                super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
                super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data
                [1];
  }
  else {
    fStack_84 = bVar18.super_simd_register<float,_xsimd::sse4_2>.
                super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
                super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data
                [1];
    iVar7 = -(uint)(0.0 <= fVar13);
    iVar8 = -(uint)(0.0 <= fVar14);
    iVar9 = -(uint)(0.0 <= fVar15);
    iVar10 = -(uint)(0.0 <= fVar16);
    auVar3._4_4_ = iVar8;
    auVar3._0_4_ = iVar7;
    auVar3._8_4_ = iVar9;
    auVar3._12_4_ = iVar10;
    iVar6 = movmskps(iVar6,auVar3);
    auVar4._4_4_ = iVar8;
    auVar4._0_4_ = iVar7;
    auVar4._8_4_ = iVar9;
    auVar4._12_4_ = iVar10;
    auVar12 = blendvps(auVar11,auVar12,auVar4);
    auVar11._0_8_ = auVar12._0_8_;
    if (iVar6 != 0) {
      local_88 = auVar12._0_4_;
      fStack_84 = auVar12._4_4_;
    }
  }
  bVar19.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] = fStack_84;
  bVar19.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] = local_88;
  bVar19.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[2] = (float)(int)auVar11._0_8_;
  bVar19.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[3] = (float)(int)((ulong)auVar11._0_8_ >> 0x20);
  return (batch)bVar19.super_simd_register<float,_xsimd::sse4_2>.
                super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
                super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data
  ;
}

Assistant:

batch weight_stadium(PolarExtentCoreContext &ctx,
                         const PositionBatch<batch> &position) const {
      PositionBatch<batch> position_t = position.transform(ctx.flippedBasis);

      PositionBatch<batch> position_t_right = position_t;
      position_t_right.x = xsimd::abs(position_t.x);

      auto circle_test_dot =
          xsimd::fma(position_t_right.x, batch{ctx.circle_test[0]},
                     position_t_right.y * batch{ctx.circle_test[1]});
      auto in_straight_line_part = circle_test_dot >= batch{0.0};

      // for the straight line part
      auto straight_val = weight_from_sin(ctx, xsimd::abs(position_t.z));

      // for the circle part
      auto circle_dot =
          xsimd::fma(position_t_right.x, batch{ctx.right_circle_centre[0]},
                     position_t_right.y * batch{ctx.right_circle_centre[1]});
      auto circle_val = weight_from_cos(ctx, circle_dot);

      if (xsimd::all(in_straight_line_part))
        return straight_val;
      else if (xsimd::none(in_straight_line_part))
        return circle_val;
      else
        return xsimd::select(in_straight_line_part, straight_val, circle_val);
    }